

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::computeOptimizationHints(SchemaLoader *this)

{
  Maybe<kj::_::Mutex::Waiter_&> local_10;
  
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffe8,this);
  Impl::computeOptimizationHints((Impl *)(local_10.ptr)->prev);
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)&stack0xffffffffffffffe8
            );
  return;
}

Assistant:

void SchemaLoader::computeOptimizationHints() {
  impl.lockExclusive()->get()->computeOptimizationHints();
}